

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O0

qpdf_offset_t __thiscall QPDF::getLinearizationOffset(QPDF *this,QPDFObjGen og)

{
  int iVar1;
  pointer pMVar2;
  mapped_type *pmVar3;
  allocator<char> local_69;
  string local_68;
  QPDFObjGen local_48;
  qpdf_offset_t local_40;
  qpdf_offset_t result;
  QPDFXRefEntry entry;
  QPDF *this_local;
  QPDFObjGen og_local;
  
  this_local = (QPDF *)og;
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  pmVar3 = std::
           map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
           ::operator[](&pMVar2->xref_table,(key_type *)&this_local);
  entry.field1 = *(qpdf_offset_t *)&pmVar3->field2;
  result = *(qpdf_offset_t *)pmVar3;
  entry._0_8_ = pmVar3->field1;
  local_40 = 0;
  iVar1 = QPDFXRefEntry::getType((QPDFXRefEntry *)&result);
  if (iVar1 == 1) {
    local_40 = QPDFXRefEntry::getOffset((QPDFXRefEntry *)&result);
  }
  else if (iVar1 == 2) {
    iVar1 = QPDFXRefEntry::getObjStreamNumber((QPDFXRefEntry *)&result);
    QPDFObjGen::QPDFObjGen(&local_48,iVar1,0);
    local_40 = getLinearizationOffset(this,local_48);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"getLinearizationOffset called for xref entry not of type 1 or 2"
               ,&local_69);
    stopOnError(this,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
  }
  return local_40;
}

Assistant:

qpdf_offset_t
QPDF::getLinearizationOffset(QPDFObjGen og)
{
    QPDFXRefEntry entry = m->xref_table[og];
    qpdf_offset_t result = 0;
    switch (entry.getType()) {
    case 1:
        result = entry.getOffset();
        break;

    case 2:
        // For compressed objects, return the offset of the object stream that contains them.
        result = getLinearizationOffset(QPDFObjGen(entry.getObjStreamNumber(), 0));
        break;

    default:
        stopOnError("getLinearizationOffset called for xref entry not of type 1 or 2");
        break;
    }
    return result;
}